

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O1

void __thiscall
helics::HandleManager::removeFederateHandles(HandleManager *this,GlobalFederateId fedToRemove)

{
  _Elt_pointer pBVar1;
  _Elt_pointer pBVar2;
  BasicHandleInfo *handle;
  _Elt_pointer pBVar3;
  _Map_pointer ppBVar4;
  
  pBVar3 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_start._M_cur;
  pBVar1 = (this->handles).
           super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pBVar3 != pBVar1) {
    pBVar2 = (this->handles).
             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
             _M_impl.super__Deque_impl_data._M_start._M_last;
    ppBVar4 = (this->handles).
              super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    do {
      if ((pBVar3->handle).fed_id.gid == fedToRemove.gid) {
        removeHandle(this,pBVar3->handle);
      }
      pBVar3 = pBVar3 + 1;
      if (pBVar3 == pBVar2) {
        pBVar3 = ppBVar4[1];
        ppBVar4 = ppBVar4 + 1;
        pBVar2 = pBVar3 + 3;
      }
    } while (pBVar3 != pBVar1);
  }
  return;
}

Assistant:

void HandleManager::setHandleOption(InterfaceHandle handle, int32_t option, int32_t val)
{
    auto index = handle.baseValue();
    if (isValidIndex(index, handles)) {
        switch (option) {
            case HELICS_HANDLE_OPTION_CONNECTION_REQUIRED:
                if (val != 0) {
                    clearActionFlag(handles[index], optional_flag);
                    setActionFlag(handles[index], required_flag);
                } else {
                    clearActionFlag(handles[index], required_flag);
                }
                break;
            case HELICS_HANDLE_OPTION_CONNECTION_OPTIONAL:
                if (val != 0) {
                    clearActionFlag(handles[index], required_flag);
                    setActionFlag(handles[index], optional_flag);
                } else {
                    clearActionFlag(handles[index], optional_flag);
                }
                break;
            case HELICS_HANDLE_OPTION_RECEIVE_ONLY:
                if (handles[index].handleType == InterfaceType::ENDPOINT) {
                    if (val != 0) {
                        setActionFlag(handles[index], receive_only_flag);
                    } else {
                        clearActionFlag(handles[index], receive_only_flag);
                    }
                }
                break;
            case HELICS_HANDLE_OPTION_RECONNECTABLE:
                if (val != 0) {
                    setActionFlag(handles[index], reconnectable_flag);
                } else {
                    clearActionFlag(handles[index], reconnectable_flag);
                }
                break;
            default:
                break;
        }
    }
}